

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError encode_number_no_update(CborEncoder *encoder,uint64_t ui,uint8_t shiftedMajorType)

{
  uint uVar1;
  CborError CVar2;
  char *where;
  char in_DL;
  ulong in_RSI;
  long in_FS_OFFSET;
  uint8_t more;
  uint8_t *bufstart;
  uint8_t *bufend;
  uint64_t buf [2];
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  sbyte sVar3;
  anon_union_8_3_8ebc2b8a_for_data *encoder_00;
  undefined8 local_10;
  anon_union_8_3_8ebc2b8a_for_data local_8;
  
  local_8 = (anon_union_8_3_8ebc2b8a_for_data)
            ((anon_union_8_3_8ebc2b8a_for_data *)(in_FS_OFFSET + 0x28))->ptr;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  encoder_00 = &local_8;
  where = (char *)((long)&local_10 + 7);
  put64(where,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (in_RSI < 0x18) {
    *where = *where + in_DL;
  }
  else {
    uVar1 = in_stack_ffffffffffffffbc & 0xffffff;
    if (0xff < in_RSI) {
      uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
    }
    in_stack_ffffffffffffffbc = uVar1;
    if (0xffff < in_RSI) {
      in_stack_ffffffffffffffbc =
           CONCAT13((char)(in_stack_ffffffffffffffbc >> 0x18) + '\x01',
                    (int3)in_stack_ffffffffffffffbc);
    }
    if (0xffffffff < in_RSI) {
      in_stack_ffffffffffffffbc =
           CONCAT13((char)(in_stack_ffffffffffffffbc >> 0x18) + '\x01',
                    (int3)in_stack_ffffffffffffffbc);
    }
    sVar3 = (sbyte)(in_stack_ffffffffffffffbc >> 0x18);
    where = where + -(1L << sVar3);
    *where = in_DL + '\x18' + sVar3;
  }
  CVar2 = append_to_buffer((CborEncoder *)encoder_00,where,
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           CborEncoderAppendCborData);
  if (*(uint8_t **)(in_FS_OFFSET + 0x28) == local_8.ptr) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

static inline CborError encode_number_no_update(CborEncoder *encoder, uint64_t ui, uint8_t shiftedMajorType)
{
    /* Little-endian would have been so much more convenient here:
     * We could just write at the beginning of buf but append_to_buffer
     * only the necessary bytes.
     * Since it has to be big endian, do it the other way around:
     * write from the end. */
    uint64_t buf[2];
    uint8_t *const bufend = (uint8_t *)buf + sizeof(buf);
    uint8_t *bufstart = bufend - 1;
    put64(buf + 1, ui);     /* we probably have a bunch of zeros in the beginning */

    if (ui < Value8Bit) {
        *bufstart += shiftedMajorType;
    } else {
        uint8_t more = 0;
        if (ui > 0xffU)
            ++more;
        if (ui > 0xffffU)
            ++more;
        if (ui > 0xffffffffU)
            ++more;
        bufstart -= (size_t)1 << more;
        *bufstart = shiftedMajorType + Value8Bit + more;
    }

    return append_to_buffer(encoder, bufstart, bufend - bufstart, CborEncoderAppendCborData);
}